

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O1

sequence * toml::detail::syntax::exponent_part(sequence *__return_storage_ptr__,spec *s)

{
  initializer_list<unsigned_char> cs;
  initializer_list<unsigned_char> cs_00;
  uchar local_8c [4];
  maybe local_88;
  character_either local_78;
  character_either local_58;
  sequence local_38;
  
  local_8c[2] = 'e';
  local_8c[3] = 'E';
  cs._M_len = 2;
  cs._M_array = local_8c + 2;
  character_either::character_either(&local_78,cs);
  local_8c[0] = '+';
  local_8c[1] = '-';
  cs_00._M_len = 2;
  cs_00._M_array = local_8c;
  character_either::character_either(&local_58,cs_00);
  local_88.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__maybe_004e0af8;
  scanner_storage::scanner_storage<toml::detail::character_either,_nullptr>
            (&local_88.other_,&local_58);
  zero_prefixable_int(&local_38,s);
  sequence::sequence<toml::detail::character_either,toml::detail::maybe,toml::detail::sequence>
            (__return_storage_ptr__,&local_78,&local_88,&local_38);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_38.others_);
  if (local_88.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_88.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  local_88.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  if (local_58.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.chars_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.chars_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence exponent_part(const spec& s)
{
    return sequence(
            character_either{char_type('e'), char_type('E')},
            maybe(character_either{char_type('+'), char_type('-')}),
            zero_prefixable_int(s)
        );
}